

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

Vec_Vec_t * Nwk_ManLevelize(Nwk_Man_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *p;
  Nwk_Obj_t *p_00;
  int local_28;
  int i;
  int nLevels;
  Vec_Vec_t *vLevels;
  Nwk_Obj_t *pObj;
  Nwk_Man_t *pNtk_local;
  
  iVar1 = Nwk_ManVerifyLevel(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Nwk_ManVerifyLevel(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkDfs.c"
                  ,0x112,"Vec_Vec_t *Nwk_ManLevelize(Nwk_Man_t *)");
  }
  iVar1 = Nwk_ManLevelMax(pNtk);
  p = Vec_VecStart(iVar1 + 1);
  local_28 = 0;
  do {
    iVar2 = Vec_PtrSize(pNtk->vObjs);
    if (iVar2 <= local_28) {
      return p;
    }
    p_00 = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,local_28);
    if ((p_00 != (Nwk_Obj_t *)0x0) && (iVar2 = Nwk_ObjIsNode(p_00), iVar2 != 0)) {
      iVar2 = Nwk_ObjLevel(p_00);
      if (iVar1 < iVar2) {
        __assert_fail("Nwk_ObjLevel(pObj) <= nLevels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkDfs.c"
                      ,0x117,"Vec_Vec_t *Nwk_ManLevelize(Nwk_Man_t *)");
      }
      iVar2 = Nwk_ObjLevel(p_00);
      Vec_VecPush(p,iVar2,p_00);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Vec_Vec_t * Nwk_ManLevelize( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    assert( Nwk_ManVerifyLevel(pNtk) );
    nLevels = Nwk_ManLevelMax( pNtk );
    vLevels = Vec_VecStart( nLevels + 1 );
    Nwk_ManForEachNode( pNtk, pObj, i )
    {
        assert( Nwk_ObjLevel(pObj) <= nLevels );
        Vec_VecPush( vLevels, Nwk_ObjLevel(pObj), pObj );
    }
    return vLevels;
}